

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O2

void __thiscall
mjs::native_error_exception::native_error_exception
          (native_error_exception *this,native_error_type type,wstring_view *stack_trace,
          wstring_view *msg)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  string local_1c8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  pcVar1 = type_string(type);
  poVar2 = std::operator<<((ostream *)&oss,pcVar1);
  poVar2 = std::operator<<(poVar2,": ");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)local_1e8,msg->_M_str,msg->_M_str + msg->_M_len);
  std::operator<<(poVar2,(string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  if (stack_trace->_M_len != 0) {
    poVar2 = std::operator<<((ostream *)&oss,'\n');
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<wchar_t_const*>
              ((string *)local_1e8,stack_trace->_M_str,stack_trace->_M_str + stack_trace->_M_len);
    std::operator<<(poVar2,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  eval_exception::runtime_error(&this->super_eval_exception,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  *(undefined ***)&this->super_eval_exception = &PTR__native_error_exception_001c3238;
  this->type_ = type;
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->msg_,msg,(allocator<wchar_t> *)&oss);
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->stack_trace_,stack_trace,(allocator<wchar_t> *)&oss);
  return;
}

Assistant:

native_error_exception::native_error_exception(native_error_type type, const std::wstring_view& stack_trace, const std::wstring_view& msg)
    : eval_exception{get_eval_exception_repr(type, stack_trace, msg)}
    , type_{type}
    , msg_{msg}
    , stack_trace_{stack_trace} {
}